

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

PrintStatement * __thiscall Parser::printStmt(Parser *this)

{
  bool bVar1;
  Testlist *testlist;
  PrintStatement *this_00;
  undefined8 extraout_RAX;
  allocator<char> local_131;
  string local_130;
  string local_110;
  Token tok;
  Token printKeyword;
  
  Tokenizer::getToken(&printKeyword,this->tokenizer);
  bVar1 = Token::isPrint(&printKeyword);
  if (bVar1) {
    Tokenizer::getToken(&tok,this->tokenizer);
    if (tok._eol == false) {
      Tokenizer::ungetToken(this->tokenizer);
      testlist = testList(this);
      this_00 = (PrintStatement *)operator_new(0x68);
      PrintStatement::PrintStatement(this_00,testlist);
    }
    else {
      Tokenizer::ungetToken(this->tokenizer);
      this_00 = (PrintStatement *)0x0;
    }
    Token::~Token(&tok);
    Token::~Token(&printKeyword);
    return this_00;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"Parser::printStmt",(allocator<char> *)&tok);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"Expected a name token, instead got",&local_131);
  die(this,&local_110,&local_130,&printKeyword);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  Token::~Token(&printKeyword);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

PrintStatement *Parser::printStmt() {
    //'print' [ testlist ]


    Token printKeyword = tokenizer.getToken();
    if (!printKeyword.isPrint())
        die("Parser::printStmt", "Expected a name token, instead got", printKeyword);
    Testlist *list = nullptr;
    Token tok = tokenizer.getToken();

    if (!tok.eol()) {
        tokenizer.ungetToken();
        list = testList();
    } else{
        tokenizer.ungetToken();
        return nullptr;
    }
    auto *printStatement = new PrintStatement(list);
    return printStatement;
}